

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

TableIterable<kj::TreeMap<kj::String,_int>::Entry,_decltype(inner)> * __thiscall
kj::Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
::range<0ul,char_const(&)[4],char_const(&)[4]>
          (TableIterable<kj::TreeMap<kj::String,_int>::Entry,_decltype(inner)>
           *__return_storage_ptr__,
          Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
          *this,char (*begin) [4],char (*end) [4])

{
  IterRange<kj::_::BTreeImpl::Iterator> inner;
  SearchKey local_a8;
  Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
  *local_a0;
  long *local_98;
  char (*local_90) [4];
  long local_88;
  long local_80;
  SearchKey local_78;
  Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
  *pTStack_70;
  SearchKey *local_68;
  Iterator local_60;
  Iterator local_48;
  
  local_a8._vptr_SearchKey = *(_func_char_7_ ***)this;
  local_a0 = (Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
              *)(*(long *)(this + 8) - (long)local_a8._vptr_SearchKey >> 5);
  local_68 = &local_a8;
  local_78._vptr_SearchKey = (_func_char_7_ **)&PTR_search_002253c0;
  pTStack_70 = this + 0x20;
  local_60.tree = (NodeUnion *)begin;
  _::BTreeImpl::search(&local_48,(BTreeImpl *)(this + 0x28),&local_78);
  local_88 = *(long *)this;
  local_80 = *(long *)(this + 8) - local_88 >> 5;
  local_98 = &local_88;
  local_a8._vptr_SearchKey = (_func_char_7_ **)&PTR_search_002253c0;
  local_a0 = this + 0x20;
  local_90 = end;
  _::BTreeImpl::search(&local_60,(BTreeImpl *)(this + 0x28),&local_a8);
  (__return_storage_ptr__->inner).e.leaf = local_60.leaf;
  (__return_storage_ptr__->inner).e.row = local_60.row;
  *(undefined4 *)&(__return_storage_ptr__->inner).e.field_0x14 = local_60._20_4_;
  (__return_storage_ptr__->inner).b.tree = local_48.tree;
  (__return_storage_ptr__->inner).b.leaf = local_48.leaf;
  (__return_storage_ptr__->inner).b.row = local_48.row;
  *(undefined4 *)&(__return_storage_ptr__->inner).b.field_0x14 = local_48._20_4_;
  (__return_storage_ptr__->inner).e.tree = local_60.tree;
  (__return_storage_ptr__->super_TableMapping<kj::TreeMap<kj::String,_int>::Entry>).table =
       *(StringPtr **)this;
  return __return_storage_ptr__;
}

Assistant:

auto Table<Row, Indexes...>::range(BeginKey&& begin, EndKey&& end) {
  auto inner = _::iterRange(get<index>(indexes).seek(rows.asPtr(), kj::fwd<BeginKey>(begin)),
                            get<index>(indexes).seek(rows.asPtr(), kj::fwd<EndKey>(end)));
  return _::TableIterable<Row, decltype(inner)>(kj::mv(inner), rows.begin());
}